

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void Curl_cpool_prune_dead(Curl_easy *data)

{
  undefined8 uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  cpool *cpool;
  timediff_t tVar4;
  curltime cVar5;
  curltime newer;
  curltime older;
  time_t local_40;
  int iStack_38;
  undefined4 uStack_34;
  
  cpool = cpool_get_instance(data);
  if (cpool != (cpool *)0x0) {
    cVar5 = Curl_now();
    local_40 = cVar5.tv_sec;
    iStack_38 = cVar5.tv_usec;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x68 = cpool->field_0x68 | 1;
    uVar1 = (cpool->last_cleanup).tv_sec;
    uVar2 = (cpool->last_cleanup).tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar5._0_12_,0);
    newer.tv_usec = SUB124(cVar5._0_12_,8);
    older._12_4_ = 0;
    tVar4 = Curl_timediff(newer,older);
    if (999 < tVar4) {
      do {
        _Var3 = cpool_foreach(data,cpool,&local_40,cpool_reap_dead_cb);
      } while (_Var3);
      (cpool->last_cleanup).tv_sec = local_40;
      *(ulong *)&(cpool->last_cleanup).tv_usec = CONCAT44(uStack_34,iStack_38);
    }
    cpool->field_0x68 = cpool->field_0x68 & 0xfe;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_cpool_prune_dead(struct Curl_easy *data)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_reaper_ctx rctx;
  timediff_t elapsed;

  if(!cpool)
    return;

  rctx.now = Curl_now();
  CPOOL_LOCK(cpool, data);
  elapsed = Curl_timediff(rctx.now, cpool->last_cleanup);

  if(elapsed >= 1000L) {
    while(cpool_foreach(data, cpool, &rctx, cpool_reap_dead_cb))
      ;
    cpool->last_cleanup = rctx.now;
  }
  CPOOL_UNLOCK(cpool, data);
}